

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O2

bool remote::FindProcessByName(string *name,Handle *out)

{
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  long lVar4;
  string exeName;
  string procPath;
  string mapsPath;
  string local_98;
  Handle proc;
  
  if (((out != (Handle *)0x0) && (name->_M_string_length != 0)) &&
     (__dirp = opendir("/proc/"), __dirp != (DIR *)0x0)) {
    while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
      if (pdVar3->d_type == '\x04') {
        std::__cxx11::string::string((string *)&procPath,pdVar3->d_name,(allocator *)&exeName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proc,
                       "/proc/",&procPath);
        std::operator+(&mapsPath,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proc,
                       "/maps");
        std::__cxx11::string::~string((string *)&proc);
        std::__cxx11::string::~string((string *)&procPath);
        iVar2 = access(mapsPath._M_dataplus._M_p,0);
        if (iVar2 == -1) {
LAB_00105606:
          std::__cxx11::string::~string((string *)&mapsPath);
        }
        else {
          std::__cxx11::string::string((string *)&local_98,pdVar3->d_name,(allocator *)&procPath);
          Handle::Handle(&proc,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          if ((proc.pid == -1) || (bVar1 = Handle::IsRunning(&proc), !bVar1)) {
            Handle::~Handle(&proc);
            goto LAB_00105606;
          }
          Handle::GetPath_abi_cxx11_(&procPath,&proc);
          bVar1 = false;
          if (procPath._M_string_length != 0) {
            lVar4 = std::__cxx11::string::rfind((char)&procPath,0x2f);
            bVar1 = false;
            if (lVar4 != -1) {
              std::__cxx11::string::substr((ulong)&exeName,(ulong)&procPath);
              iVar2 = std::__cxx11::string::compare((string *)&exeName);
              bVar1 = iVar2 == 0;
              if (bVar1) {
                Handle::operator=(out,&proc);
              }
              std::__cxx11::string::~string((string *)&exeName);
            }
          }
          std::__cxx11::string::~string((string *)&procPath);
          Handle::~Handle(&proc);
          std::__cxx11::string::~string((string *)&mapsPath);
          if (bVar1) {
            return true;
          }
        }
      }
    }
    closedir(__dirp);
  }
  return false;
}

Assistant:

bool remote::FindProcessByName(std::string name, remote::Handle* out) {
    if(out == NULL || name.empty())
        return false;

    struct dirent *dire;

    DIR *dir = opendir("/proc/");

    if (dir) {
        while ((dire = readdir(dir)) != NULL) {
            if (dire->d_type != DT_DIR)
                continue;

            std::string mapsPath = ("/proc/" + std::string(dire->d_name) + "/maps");

            if (access(mapsPath.c_str(), F_OK) == -1)
                continue;

            remote::Handle proc(dire->d_name);

            if (!proc.IsValid() || !proc.IsRunning())
                continue;

            std::string procPath = proc.GetPath();

            if(procPath.empty())
                continue;

            size_t namePos = procPath.find_last_of('/');

            if(namePos == -1)
                continue; // what?

            std::string exeName = procPath.substr(namePos + 1);

            if(exeName.compare(name) == 0) {
                *out = proc;

                return true;
            }
        }

        closedir(dir);
    }

    return false;
}